

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GatherNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gathernd(NeuralNetworkLayer *this)

{
  bool bVar1;
  GatherNDLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_gathernd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gathernd(this);
    this_00 = (GatherNDLayerParams *)operator_new(0x18);
    GatherNDLayerParams::GatherNDLayerParams(this_00);
    (this->layer_).gathernd_ = this_00;
  }
  return (GatherNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherNDLayerParams* NeuralNetworkLayer::mutable_gathernd() {
  if (!has_gathernd()) {
    clear_layer();
    set_has_gathernd();
    layer_.gathernd_ = new ::CoreML::Specification::GatherNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gatherND)
  return layer_.gathernd_;
}